

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsidebar.cpp
# Opt level: O0

void __thiscall QSidebar::selectUrl(QSidebar *this,QUrl *url)

{
  bool bVar1;
  int iVar2;
  QItemSelectionModel *pQVar3;
  QAbstractItemModel *pQVar4;
  ContextType *in_RDI;
  long in_FS_OFFSET;
  int i;
  undefined4 in_stack_fffffffffffffe98;
  SelectionFlag in_stack_fffffffffffffe9c;
  Object *in_stack_fffffffffffffea0;
  Object *in_stack_fffffffffffffea8;
  Connection *this_00;
  QAbstractItemView *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  uint uVar5;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  int iVar6;
  int local_fc;
  offset_in_QItemSelectionModel_to_subr signal;
  ConnectionType type;
  ContextType *pCVar7;
  Connection local_b8;
  undefined4 local_ac;
  undefined1 local_a8 [24];
  undefined1 local_90 [24];
  undefined1 local_78 [24];
  undefined1 local_60 [24];
  QUrl local_48;
  undefined1 local_40 [24];
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar7 = in_RDI;
  QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_fffffffffffffea0);
  signal = 0;
  QObject::
  disconnect<void(QItemSelectionModel::*)(QModelIndex_const&,QModelIndex_const&),void(QSidebar::*)(QModelIndex_const&)>
            (in_stack_fffffffffffffea8,CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0)
             ,in_stack_fffffffffffffea0,
             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  pQVar3 = QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_fffffffffffffea0);
  (**(code **)(*(long *)pQVar3 + 0x78))();
  local_fc = 0;
  do {
    iVar6 = local_fc;
    pQVar4 = QAbstractItemView::model(in_stack_fffffffffffffeb0);
    QModelIndex::QModelIndex((QModelIndex *)0x787054);
    iVar2 = (**(code **)(*(long *)pQVar4 + 0x78))(pQVar4,local_40);
    type = (ConnectionType)pCVar7;
    if (iVar2 <= iVar6) {
LAB_007871bd:
      QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_fffffffffffffea0);
      this_00 = &local_b8;
      QObject::
      connect<void(QItemSelectionModel::*)(QModelIndex_const&,QModelIndex_const&),void(QSidebar::*)(QModelIndex_const&)>
                ((Object *)QItemSelectionModel::currentChanged,signal,in_RDI,
                 (offset_in_QSidebar_to_subr *)CONCAT44(iVar6,in_stack_fffffffffffffee0),type);
      QMetaObject::Connection::~Connection(this_00);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return;
      }
      __stack_chk_fail();
    }
    pQVar4 = QAbstractItemView::model(in_stack_fffffffffffffeb0);
    iVar2 = local_fc;
    QModelIndex::QModelIndex((QModelIndex *)0x787099);
    (**(code **)(*(long *)pQVar4 + 0x60))(local_60,pQVar4,iVar2,0,local_78);
    QModelIndex::data((QModelIndex *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                      (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
    ::QVariant::toUrl();
    bVar1 = ::operator==((QUrl *)in_stack_fffffffffffffea0,
                         (QUrl *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    uVar5 = (uint)bVar1 << 0x18;
    QUrl::~QUrl(&local_48);
    ::QVariant::~QVariant(&local_28);
    type = (ConnectionType)pCVar7;
    if ((uVar5 & 0x1000000) != 0) {
      pQVar3 = QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_fffffffffffffea0);
      pQVar4 = QAbstractItemView::model(in_stack_fffffffffffffeb0);
      QModelIndex::QModelIndex((QModelIndex *)0x78715c);
      (**(code **)(*(long *)pQVar4 + 0x60))(local_90,pQVar4,local_fc,0,local_a8);
      QFlags<QItemSelectionModel::SelectionFlag>::QFlags
                ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_fffffffffffffea0,
                 in_stack_fffffffffffffe9c);
      (**(code **)(*(long *)pQVar3 + 0x68))(pQVar3,local_90,local_ac);
      goto LAB_007871bd;
    }
    local_fc = local_fc + 1;
  } while( true );
}

Assistant:

void QSidebar::selectUrl(const QUrl &url)
{
    disconnect(selectionModel(), &QItemSelectionModel::currentChanged,
               this, &QSidebar::clicked);

    selectionModel()->clear();
    for (int i = 0; i < model()->rowCount(); ++i) {
        if (model()->index(i, 0).data(QUrlModel::UrlRole).toUrl() == url) {
            selectionModel()->select(model()->index(i, 0), QItemSelectionModel::Select);
            break;
        }
    }

    connect(selectionModel(), &QItemSelectionModel::currentChanged,
            this, &QSidebar::clicked);
}